

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall Diffusion::echo_settings(Diffusion *this)

{
  ostream *poVar1;
  Print *pPVar2;
  int i;
  long lVar3;
  long lVar4;
  Print PStack_1b8;
  
  if (verbose != 0) {
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"Diffusion settings...\n");
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"  From diffuse:\n");
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   max_order           = ");
    pPVar2 = amrex::Print::operator<<(&PStack_1b8,&max_order);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   tensor_max_order    = ");
    pPVar2 = amrex::Print::operator<<(&PStack_1b8,&tensor_max_order);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   scale_abec          = ");
    pPVar2 = amrex::Print::operator<<(&PStack_1b8,&scale_abec);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"\n\n  From ns:\n");
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   do_reflux           = ");
    pPVar2 = amrex::Print::operator<<(&PStack_1b8,&do_reflux);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   visc_tol            = ");
    pPVar2 = amrex::Print::operator<<(&PStack_1b8,&visc_tol);
    std::operator<<((ostream *)&pPVar2->ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,"   is_diffusive =");
    amrex::Print::~Print(&PStack_1b8);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < this->NUM_STATE; lVar3 = lVar3 + 1) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&PStack_1b8,poVar1);
      std::operator<<((ostream *)&PStack_1b8.ss,"  ");
      amrex::Print::operator<<
                (&PStack_1b8,
                 (int *)((long)is_diffusive.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar4));
      amrex::Print::~Print(&PStack_1b8);
      lVar4 = lVar4 + 4;
    }
    poVar1 = amrex::OutStream();
    amrex::Print::Print(&PStack_1b8,poVar1);
    std::operator<<((ostream *)&PStack_1b8.ss,'\n');
    amrex::Print::~Print(&PStack_1b8);
  }
  return;
}

Assistant:

void
Diffusion::echo_settings () const
{
    //
    // Print out my settings.
    //
  if (verbose)
    {
        amrex::Print() << "Diffusion settings...\n";
        amrex::Print() << "  From diffuse:\n";
        amrex::Print() << "   max_order           = " << max_order           << '\n';
        amrex::Print() << "   tensor_max_order    = " << tensor_max_order    << '\n';
        amrex::Print() << "   scale_abec          = " << scale_abec          << '\n';

        amrex::Print() << "\n\n  From ns:\n";
        amrex::Print() << "   do_reflux           = " << do_reflux << '\n';
        amrex::Print() << "   visc_tol            = " << visc_tol  << '\n';

        amrex::Print() << "   is_diffusive =";
        for (int i =0; i < NUM_STATE; i++)
            amrex::Print() << "  " << is_diffusive[i];

        amrex::Print() << '\n';
    }
}